

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onExitIfStatementAstNode
          (CompilerAstWalker *this,IfStatementAstNode *node)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  size_type __n;
  pointer pBVar4;
  pointer pBVar5;
  reference pvVar6;
  reference pvVar7;
  element_type *peVar8;
  value_type vVar9;
  string local_58;
  allocator<char> local_31;
  
  peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar2 = (peVar8->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (peVar8->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,
             "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty"
             ,&local_31);
  Error::assertWithPanic(puVar2 != puVar3,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar8->ifConditionEvalJumpIndices,
                      ((long)(peVar8->ifConditionEvalJumpIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar8->ifConditionEvalJumpIndices).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
  __n = *pvVar6;
  peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  ppuVar1 = &(peVar8->ifConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  if ((node->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
      _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged == true) {
    puVar2 = (peVar8->elseStatementStartIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (peVar8->elseStatementStartIndex).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty"
               ,&local_31);
    Error::assertWithPanic(puVar2 != puVar3,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&peVar8->elseStatementStartIndex,
                        ((long)(peVar8->elseStatementStartIndex).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(peVar8->elseStatementStartIndex).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    vVar9 = *pvVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else"
               ,&local_31);
    Error::assertWithPanic(vVar9 != 0,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pBVar4 = (peVar8->byteCode).
             super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar5 = (peVar8->byteCode).
             super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar7 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                       (&peVar8->byteCode,vVar9 - 1);
    pvVar7->parameter = (long)pBVar5 - (long)pBVar4 >> 4;
    peVar8 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    ppuVar1 = &(peVar8->elseStatementStartIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
  }
  else {
    vVar9 = (long)(peVar8->byteCode).
                  super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(peVar8->byteCode).
                  super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
  }
  pvVar7 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::at
                     (&peVar8->byteCode,__n);
  pvVar7->parameter = vVar9;
  return;
}

Assistant:

void onExitIfStatementAstNode(IfStatementAstNode* node) noexcept override {
    Error::assertWithPanic(!this->ec->ifConditionEvalJumpIndices.empty(),
      "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty");

    std::size_t ifEvalIndex = this->ec->ifConditionEvalJumpIndices.at(this->ec->ifConditionEvalJumpIndices.size() - 1);
    this->ec->ifConditionEvalJumpIndices.pop_back();

    std::size_t jumpIndex;

    if (node->elseStatement) {
      Error::assertWithPanic(!this->ec->elseStatementStartIndex.empty(),
        "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty");

      jumpIndex = this->ec->elseStatementStartIndex.at(this->ec->elseStatementStartIndex.size() - 1);

      Error::assertWithPanic(jumpIndex > 0,
        "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else");

      this->ec->UpdateParameterAtIndex(jumpIndex - 1, this->ec->byteCode.size());

      this->ec->elseStatementStartIndex.pop_back();

    } else {
      jumpIndex = this->ec->byteCode.size();
    }

    this->ec->UpdateParameterAtIndex(ifEvalIndex, jumpIndex);
  }